

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

int BN_num_bits_word(ulong param_1)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int bits;
  unsigned_long mask;
  unsigned_long x;
  unsigned_long l_local;
  
  lVar1 = -(param_1 >> 0x20);
  uVar6 = (param_1 >> 0x20 ^ param_1) & lVar1 >> 0x3f ^ param_1;
  lVar2 = -(uVar6 >> 0x10);
  uVar6 = (uVar6 >> 0x10 ^ uVar6) & lVar2 >> 0x3f ^ uVar6;
  lVar3 = -(uVar6 >> 8);
  uVar6 = (uVar6 >> 8 ^ uVar6) & lVar3 >> 0x3f ^ uVar6;
  lVar4 = -(uVar6 >> 4);
  uVar6 = (uVar6 >> 4 ^ uVar6) & lVar4 >> 0x3f ^ uVar6;
  lVar5 = -(uVar6 >> 2);
  return (uint)(param_1 != 0) + ((uint)(lVar1 >> 0x3f) & 0x20) + ((uint)(lVar2 >> 0x3f) & 0x10) +
         ((uint)(lVar3 >> 0x3f) & 8) + ((uint)(lVar4 >> 0x3f) & 4) + ((uint)(lVar5 >> 0x3f) & 2) +
         ((uint)((long)-(((uVar6 >> 2 ^ uVar6) & lVar5 >> 0x3f ^ uVar6) >> 1) >> 0x3f) & 1);
}

Assistant:

int BN_num_bits_word(BN_ULONG l)
{
    BN_ULONG x, mask;
    int bits = (l != 0);

#if BN_BITS2 > 32
    x = l >> 32;
    mask = (0 - x) & BN_MASK2;
    mask = (0 - (mask >> (BN_BITS2 - 1)));
    bits += 32 & mask;
    l ^= (x ^ l) & mask;
#endif

    x = l >> 16;
    mask = (0 - x) & BN_MASK2;
    mask = (0 - (mask >> (BN_BITS2 - 1)));
    bits += 16 & mask;
    l ^= (x ^ l) & mask;

    x = l >> 8;
    mask = (0 - x) & BN_MASK2;
    mask = (0 - (mask >> (BN_BITS2 - 1)));
    bits += 8 & mask;
    l ^= (x ^ l) & mask;

    x = l >> 4;
    mask = (0 - x) & BN_MASK2;
    mask = (0 - (mask >> (BN_BITS2 - 1)));
    bits += 4 & mask;
    l ^= (x ^ l) & mask;

    x = l >> 2;
    mask = (0 - x) & BN_MASK2;
    mask = (0 - (mask >> (BN_BITS2 - 1)));
    bits += 2 & mask;
    l ^= (x ^ l) & mask;

    x = l >> 1;
    mask = (0 - x) & BN_MASK2;
    mask = (0 - (mask >> (BN_BITS2 - 1)));
    bits += 1 & mask;

    return bits;
}